

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O0

bool TtfUtil::GlyfPoints(gid16 nGlyphId,void *pGlyf,void *pLoca,size_t lLocaSize,void *pHead,
                        int *prgnContourEndPoint,size_t cnEndPoints,int *prgnX,int *prgnY,
                        bool *prgfOnCurve,size_t *cnPoints)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  int *in_stack_00000010;
  int *in_stack_00000018;
  char *in_stack_00000020;
  size_t *in_stack_00000028;
  uint j_1;
  int nYOff;
  int nXOff;
  int y;
  int x;
  uint j;
  bool fIdTrans;
  size_t cNestedPts;
  void *pCompGlyf;
  size_t i;
  float flt22;
  float flt21;
  float flt12;
  float flt11;
  int b;
  int a;
  bool fTransOff;
  bool fOffset;
  size_t cCurrentPoints;
  char *prgbCurrentFlag;
  int *prgnCurrentY;
  int *prgnCurrentX;
  size_t cCompId;
  size_t cCompIdTotal;
  int rgnCompId [8];
  size_t cActualPts;
  int cContours;
  void *pSimpleGlyf;
  void *in_stack_fffffffffffffed0;
  void *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  void *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef4;
  gid16 in_stack_fffffffffffffef6;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined1 local_11;
  
  std::fill_n<int*,unsigned_long,int>
            ((int *)CONCAT26(in_stack_fffffffffffffef6,
                             CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)),
             (unsigned_long)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::fill_n<int*,unsigned_long,int>
            ((int *)CONCAT26(in_stack_fffffffffffffef6,
                             CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)),
             (unsigned_long)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  bVar2 = IsSpace(in_stack_fffffffffffffef6,in_stack_fffffffffffffee8,
                  (size_t)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  if (bVar2) {
    local_11 = false;
  }
  else {
    pvVar4 = GlyfLookup((gid16)((ulong)in_stack_ffffffffffffff20 >> 0x30),in_stack_ffffffffffffff18,
                        in_stack_ffffffffffffff10,
                        CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                        (void *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    if (pvVar4 == (void *)0x0) {
      local_11 = false;
    }
    else {
      iVar3 = GlyfContourCount(in_stack_fffffffffffffed0);
      if (iVar3 < 1) {
        bVar2 = GetComponentGlyphIds
                          ((void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (size_t *)
                           CONCAT26(in_stack_fffffffffffffef6,
                                    CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)));
        if (bVar2) {
          sVar1 = *in_stack_00000028;
          SimplifyFlags(in_stack_00000020,*in_stack_00000028);
          *in_stack_00000028 = sVar1;
          local_11 = true;
        }
        else {
          local_11 = false;
        }
      }
      else {
        bVar2 = GlyfPoints((void *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                           in_stack_ffffffffffffff10,
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (size_t *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        if (bVar2) {
          CalcAbsolutePoints(in_stack_00000010,in_stack_00000018,*in_stack_00000028);
          SimplifyFlags(in_stack_00000020,*in_stack_00000028);
          local_11 = true;
        }
        else {
          local_11 = false;
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool GlyfPoints(gr::gid16 nGlyphId, const void * pGlyf,
		const void * pLoca, size_t lLocaSize, const void * pHead,
		const int * prgnContourEndPoint, size_t cnEndPoints,
		int * prgnX, int * prgnY, bool * prgfOnCurve, size_t & cnPoints)
{
	std::fill_n(prgnX, cnPoints, INT_MAX);
	std::fill_n(prgnY, cnPoints, INT_MAX);

	if (IsSpace(nGlyphId, pLoca, lLocaSize, pHead)) 
		return false;

	void * pSimpleGlyf = GlyfLookup(nGlyphId, pGlyf, pLoca, lLocaSize, pHead);
	if (pSimpleGlyf == NULL)
		return false;

	int cContours = GlyfContourCount(pSimpleGlyf);
	size_t cActualPts;
	if (cContours > 0)
	{
		if (!GlyfPoints(pSimpleGlyf, prgnX, prgnY, (char *)prgfOnCurve, cnPoints, cActualPts))
			return false;
		CalcAbsolutePoints(prgnX, prgnY, cnPoints);
		SimplifyFlags((char *)prgfOnCurve, cnPoints);
		return true;
	}

	// handle composite glyphs	
	int rgnCompId[kMaxGlyphComponents]; // assumes no glyph will be made of more than 8 components
	size_t cCompIdTotal = kMaxGlyphComponents;
	size_t cCompId = 0;

	// this will fail if there are more components than there is room for
	if (!GetComponentGlyphIds(pSimpleGlyf, rgnCompId, cCompIdTotal, cCompId))
		return false;

	int * prgnCurrentX = prgnX;
	int * prgnCurrentY = prgnY;
	char * prgbCurrentFlag = (char *)prgfOnCurve; // converting bool to char should be safe
	auto cCurrentPoints = cnPoints;
	bool fOffset = true, fTransOff = true;
	int a, b;
	float flt11, flt12, flt21, flt22;
	// int * prgnPrevX = prgnX; // in case first att pt number relative to preceding glyph
	// int * prgnPrevY = prgnY;
	for (size_t i = 0; i < cCompId; i++)
	{
		if (IsSpace(static_cast<gr::gid16>(rgnCompId[i]), pLoca, lLocaSize, pHead)) {return false;}
		void * pCompGlyf = GlyfLookup(static_cast<gr::gid16>(rgnCompId[i]), pGlyf, 
										pLoca, lLocaSize, pHead);
		if (pCompGlyf == NULL) {return false;}
		if (!GlyfPoints(pCompGlyf, prgnCurrentX, prgnCurrentY, prgbCurrentFlag, 
						cCurrentPoints, cActualPts))
		{
			auto cNestedPts = cCurrentPoints;
			if (!GlyfPoints(static_cast<gr::gid16>(rgnCompId[i]), pGlyf, pLoca, lLocaSize, pHead, 
				prgnContourEndPoint, cnEndPoints, prgnCurrentX, prgnCurrentY, (bool *)prgbCurrentFlag, 
				cNestedPts))
				return false;
			cActualPts = cCurrentPoints - cNestedPts;
		} 
		else
		{
			// convert points to absolute coordinates
			// do before transform and attachment point placement are applied
			CalcAbsolutePoints(prgnCurrentX, prgnCurrentY, cActualPts);
		}

		if (!GetComponentPlacement(pSimpleGlyf, rgnCompId[i], fOffset, a, b))
			return false;
		if (!GetComponentTransform(pSimpleGlyf, rgnCompId[i], 
			flt11, flt12, flt21, flt22, fTransOff))
			return false;
		bool fIdTrans = flt11 == 1.0 && flt12 == 0.0 && flt21 == 0.0 && flt22 == 1.0;

		// apply transform - see main method note above
		// do before attachment point calcs
		if (!fIdTrans)
			for (auto j = 0U; j < cActualPts; j++)
			{
				int x = prgnCurrentX[j]; // store before transform applied
				int y = prgnCurrentY[j];
				prgnCurrentX[j] = (int)(x * flt11 + y * flt12);
				prgnCurrentY[j] = (int)(x * flt21 + y * flt22);
			}
			
		// apply placement - see main method note above
		int nXOff, nYOff;
		if (fOffset) // explicit x & y offsets
		{ 
			/* ignore fTransOff for now
			if (fTransOff && !fIdTrans) 
			{ 	// transform x & y offsets
				nXOff = (int)(a * flt11 + b * flt12);
				nYOff = (int)(a * flt21 + b * flt22);
			}
			else */ 
			{ // don't transform offset
				nXOff = a;
				nYOff = b;
			}
		}
		else  // attachment points
		{	// in case first point is relative to preceding glyph and second relative to current
			// nXOff = prgnPrevX[a] - prgnCurrentX[b];
			// nYOff = prgnPrevY[a] - prgnCurrentY[b];
			// first point number relative to whole composite, second relative to current glyph
			nXOff = prgnX[a] - prgnCurrentX[b];
			nYOff = prgnY[a] - prgnCurrentY[b];
		}
		for (auto j = 0U; j < cActualPts; j++)
		{
			prgnCurrentX[j] += nXOff;
			prgnCurrentY[j] += nYOff;
		}

		// prgnPrevX = prgnCurrentX;
		// prgnPrevY = prgnCurrentY;
		prgnCurrentX += cActualPts;
		prgnCurrentY += cActualPts;
		prgbCurrentFlag += cActualPts;
		cCurrentPoints -= cActualPts;
	}

	SimplifyFlags((char *)prgfOnCurve, cnPoints);
	cnPoints = cCurrentPoints;

	return true;
}